

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::Clara::Detail::convertInto(string *_source,bool *_dest)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  runtime_error *this;
  undefined1 *in_RSI;
  string *in_RDI;
  string sourceLC;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  undefined1 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff41;
  undefined1 in_stack_ffffffffffffff42;
  undefined1 in_stack_ffffffffffffff43;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string local_80 [32];
  char *local_60;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  string local_30 [32];
  undefined1 *local_10;
  
  __first._M_current = (char *)local_30;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)__first._M_current,in_RDI);
  local_38 = std::__cxx11::string::begin();
  local_40 = std::__cxx11::string::end();
  local_48 = std::__cxx11::string::begin();
  __last._M_current._1_1_ = in_stack_ffffffffffffff41;
  __last._M_current._0_1_ = in_stack_ffffffffffffff40;
  __last._M_current._2_1_ = in_stack_ffffffffffffff42;
  __last._M_current._3_1_ = in_stack_ffffffffffffff43;
  __last._M_current._4_1_ = in_stack_ffffffffffffff44;
  __last._M_current._5_1_ = in_stack_ffffffffffffff45;
  __last._M_current._6_1_ = in_stack_ffffffffffffff46;
  __last._M_current._7_1_ = in_stack_ffffffffffffff47;
  __result._M_current._6_1_ = in_stack_ffffffffffffff3e;
  __result._M_current._0_6_ = in_stack_ffffffffffffff38;
  __result._M_current._7_1_ = in_stack_ffffffffffffff3f;
  local_60 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (__first,__last,__result,(_func_int_int *)in_stack_ffffffffffffff30);
  bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (!bVar1) {
    bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (!bVar1) {
      bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if (!bVar1) {
        bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        if (!bVar1) {
          bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          if (!bVar1) {
            bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            if (!bVar1) {
              bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
              if (!bVar1) {
                bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                if (!bVar1) {
                  uVar2 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                  if (!(bool)uVar2) {
                    uVar3 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                    if (!(bool)uVar3) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_ffffffffffffff38)),
                                     (char *)this);
                      std::runtime_error::runtime_error(this,local_80);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                }
              }
            }
            *local_10 = 0;
            goto LAB_001d4e3a;
          }
        }
      }
    }
  }
  *local_10 = 1;
LAB_001d4e3a:
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

inline void convertInto( std::string const& _source, bool& _dest ) {
            std::string sourceLC = _source;
            std::transform( sourceLC.begin(), sourceLC.end(), sourceLC.begin(), ::tolower );
            if( sourceLC == "y" || sourceLC == "1" || sourceLC == "true" || sourceLC == "yes" || sourceLC == "on" )
                _dest = true;
            else if( sourceLC == "n" || sourceLC == "0" || sourceLC == "false" || sourceLC == "no" || sourceLC == "off" )
                _dest = false;
            else
                throw std::runtime_error( "Expected a boolean value but did not recognise:\n  '" + _source + "'" );
        }